

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

lws_mqtt_subs_t * lws_mqtt_find_sub(_lws_mqtt_related *mqtt,char *topic)

{
  int iVar1;
  lws_mqtt_subs_t *local_28;
  lws_mqtt_subs_t *s;
  char *topic_local;
  _lws_mqtt_related *mqtt_local;
  
  local_28 = mqtt->subs_head;
  while( true ) {
    if (local_28 == (lws_mqtt_subs_t *)0x0) {
      return (lws_mqtt_subs_t *)0x0;
    }
    iVar1 = strcmp(&local_28->field_0x9,topic);
    if (iVar1 == 0) break;
    local_28 = local_28->next;
  }
  return local_28;
}

Assistant:

lws_mqtt_subs_t *
lws_mqtt_find_sub(struct _lws_mqtt_related *mqtt, const char *topic)
{
	lws_mqtt_subs_t *s = mqtt->subs_head;

	while (s) {
		if (!strcmp((const char *)s->topic, topic))
			return s;
		s = s->next;
	}

	return NULL;
}